

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

int __thiscall QCss::Selector::specificity(Selector *this)

{
  int iVar1;
  bool bVar2;
  qsizetype qVar3;
  const_reference pBVar4;
  qsizetype qVar5;
  QList<QCss::BasicSelector> *in_RDI;
  BasicSelector *sel;
  int i;
  int val;
  qsizetype in_stack_ffffffffffffffc8;
  QList<QCss::BasicSelector> *in_stack_ffffffffffffffd0;
  int local_10;
  int local_c;
  
  local_c = 0;
  local_10 = 0;
  while( true ) {
    qVar3 = QList<QCss::BasicSelector>::size(in_RDI);
    if (qVar3 <= local_10) break;
    pBVar4 = QList<QCss::BasicSelector>::at(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    bVar2 = QString::isEmpty((QString *)0xa37699);
    if (!bVar2) {
      local_c = local_c + 1;
    }
    in_stack_ffffffffffffffd0 =
         (QList<QCss::BasicSelector> *)QList<QCss::Pseudo>::size(&pBVar4->pseudos);
    qVar3 = QList<QCss::AttributeSelector>::size(&pBVar4->attributeSelectors);
    iVar1 = (int)in_stack_ffffffffffffffd0;
    qVar5 = QList<QString>::size(&pBVar4->ids);
    local_c = local_c + (iVar1 + (int)qVar3) * 0x10 + (int)(qVar5 << 8);
    local_10 = local_10 + 1;
  }
  return local_c;
}

Assistant:

int Selector::specificity() const
{
    int val = 0;
    for (int i = 0; i < basicSelectors.size(); ++i) {
        const BasicSelector &sel = basicSelectors.at(i);
        if (!sel.elementName.isEmpty())
            val += 1;

        val += (sel.pseudos.size() + sel.attributeSelectors.size()) * 0x10;
        val += sel.ids.size() * 0x100;
    }
    return val;
}